

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier.cpp
# Opt level: O0

bool license::hw_identifier::operator==(HwIdentifier *lhs,HwIdentifier *rhs)

{
  byte bVar1;
  value_type_conflict vVar2;
  LCC_API_HW_IDENTIFICATION_STRATEGY LVar3;
  LCC_API_HW_IDENTIFICATION_STRATEGY LVar4;
  byte *pbVar5;
  const_reference pvVar6;
  bool local_26;
  bool local_25;
  int local_20;
  bool local_19;
  int i;
  bool equals;
  HwIdentifier *rhs_local;
  HwIdentifier *lhs_local;
  
  LVar3 = HwIdentifier::get_identification_strategy(lhs);
  LVar4 = HwIdentifier::get_identification_strategy(rhs);
  local_19 = LVar3 == LVar4;
  local_20 = 0;
  while( true ) {
    local_25 = false;
    if (local_20 < 7) {
      local_25 = local_19;
    }
    if (local_25 == false) break;
    if (local_20 == 0) {
      pbVar5 = std::array<unsigned_char,_8UL>::operator[](&rhs->m_data,1);
      bVar1 = *pbVar5;
      pbVar5 = std::array<unsigned_char,_8UL>::operator[](&lhs->m_data,1);
      local_26 = (bVar1 & 0x1f) == (*pbVar5 & 0x1f);
    }
    else {
      pvVar6 = std::array<unsigned_char,_8UL>::operator[](&lhs->m_data,(long)(local_20 + 1));
      vVar2 = *pvVar6;
      pvVar6 = std::array<unsigned_char,_8UL>::operator[](&rhs->m_data,(long)(local_20 + 1));
      local_26 = vVar2 == *pvVar6;
    }
    local_19 = local_26;
    local_20 = local_20 + 1;
  }
  return local_19;
}

Assistant:

bool operator==(const HwIdentifier& lhs, const HwIdentifier& rhs) {
	bool equals = lhs.get_identification_strategy() == rhs.get_identification_strategy();
	for (int i = 0; i < HW_IDENTIFIER_PROPRIETARY_DATA && equals; i++) {
		equals = (i == 0) ? ((rhs.m_data[i + 1] & 0x1f) == (lhs.m_data[i + 1] & 0x1f))
						  : (lhs.m_data[i + 1] == rhs.m_data[i + 1]);
	}
	return equals;
}